

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
Vector3<ExactFloat>::Vector3(Vector3<ExactFloat> *this,ExactFloat *x,ExactFloat *y,ExactFloat *z)

{
  ExactFloat *local_40;
  ExactFloat *z_local;
  ExactFloat *y_local;
  ExactFloat *x_local;
  Vector3<ExactFloat> *this_local;
  
  local_40 = this->c_;
  do {
    ExactFloat::ExactFloat(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != this[1].c_);
  ExactFloat::operator=(this->c_,x);
  ExactFloat::operator=(this->c_ + 1,y);
  ExactFloat::operator=(this->c_ + 2,z);
  return;
}

Assistant:

Vector3(T x, T y, T z) {
    c_[0] = x;
    c_[1] = y;
    c_[2] = z;
  }